

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O0

void __thiscall BGParseManager::~BGParseManager(BGParseManager *this)

{
  code *pcVar1;
  bool bVar2;
  JobProcessor *pJVar3;
  undefined4 *puVar4;
  BGParseWorkItem *pBVar5;
  BGParseWorkItem *temp;
  BGParseWorkItem *item;
  BGParseManager *this_local;
  
  pJVar3 = JsUtil::JobManager::Processor((JobManager *)this);
  (*pJVar3->_vptr_JobProcessor[1])(pJVar3,this);
  bVar2 = JsUtil::DoublyLinkedList<BGParseWorkItem,_Memory::ArenaAllocator>::IsEmpty
                    (&this->workitemsProcessing);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
                       ,0x51,"(this->workitemsProcessing.IsEmpty())",
                       "this->workitemsProcessing.IsEmpty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  temp = JsUtil::DoublyLinkedList<BGParseWorkItem,_Memory::ArenaAllocator>::Head
                   (&this->workitemsProcessed);
  while (temp != (BGParseWorkItem *)0x0) {
    pBVar5 = (BGParseWorkItem *)
             JsUtil::DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::Next
                       ((DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator> *)temp);
    JsUtil::DoublyLinkedList<BGParseWorkItem,_Memory::ArenaAllocator>::Unlink
              (&this->workitemsProcessed,temp);
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,BGParseWorkItem>
              (&Memory::HeapAllocator::Instance,temp);
    temp = pBVar5;
  }
  JsUtil::WaitableJobManager::~WaitableJobManager(&this->super_WaitableJobManager);
  return;
}

Assistant:

BGParseManager::~BGParseManager()
{
    // First, remove the manager from the JobProcessor so that any remaining jobs
    // are moved back into this manager's processed workitem list
    Processor()->RemoveManager(this);

    Assert(this->workitemsProcessing.IsEmpty());

    // Now, free all remaining processed jobs
    BGParseWorkItem *item = (BGParseWorkItem*)this->workitemsProcessed.Head();
    while (item != nullptr)
    {
        // Get the next item first so that the current item
        // can be safely removed and freed
        BGParseWorkItem* temp = item;
        item = (BGParseWorkItem*)item->Next();

        this->workitemsProcessed.Unlink(temp);
        HeapDelete(temp);
    }
}